

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * __thiscall
cmFileAPI::BuildClientReplyResponse
          (Value *__return_storage_ptr__,cmFileAPI *this,ClientRequest *request)

{
  Value *other;
  Value local_40;
  
  Json::Value::Value(__return_storage_ptr__,nullValue);
  if ((request->Error)._M_string_length == 0) {
    other = AddReplyIndexObject(this,&request->super_Object);
    Json::Value::operator=(__return_storage_ptr__,other);
  }
  else {
    BuildReplyError(&local_40,&request->Error);
    Json::Value::operator=(__return_storage_ptr__,&local_40);
    Json::Value::~Value(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReplyResponse(ClientRequest const& request)
{
  Json::Value response;
  if (!request.Error.empty()) {
    response = this->BuildReplyError(request.Error);
    return response;
  }
  response = this->AddReplyIndexObject(request);
  return response;
}